

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O1

void amrex_parsererror(char *s,...)

{
  char in_AL;
  runtime_error *this;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  char print_buff [512];
  undefined8 local_2e8;
  void **local_2e0;
  undefined1 *local_2d8;
  undefined1 local_2c8 [8];
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  char local_218 [520];
  
  local_2d8 = local_2c8;
  if (in_AL != '\0') {
    local_298 = in_XMM0_Qa;
    local_288 = in_XMM1_Qa;
    local_278 = in_XMM2_Qa;
    local_268 = in_XMM3_Qa;
    local_258 = in_XMM4_Qa;
    local_248 = in_XMM5_Qa;
    local_238 = in_XMM6_Qa;
    local_228 = in_XMM7_Qa;
  }
  local_2e0 = &vl[0].overflow_arg_area;
  local_2e8 = 0x3000000008;
  local_2c0 = in_RSI;
  local_2b8 = in_RDX;
  local_2b0 = in_RCX;
  local_2a8 = in_R8;
  local_2a0 = in_R9;
  vsnprintf(local_218,0x200,s,&local_2e8);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,local_218);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
amrex_parsererror (char const *s, ...)
{
    char print_buff[512];
    std::va_list vl;
    va_start(vl, s);
    std::vsnprintf(print_buff, 512, s, vl);
    va_end(vl);
    throw std::runtime_error(print_buff);
}